

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<bool>::Matcher(Matcher<bool> *this,bool value)

{
  EqMatcher local_29;
  MatcherBase<bool> local_28;
  
  (this->super_MatcherBase<bool>).impl_.value_ = (MatcherInterface<bool> *)0x0;
  (this->super_MatcherBase<bool>).impl_.link_.next_ = &(this->super_MatcherBase<bool>).impl_.link_;
  (this->super_MatcherBase<bool>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001b7838;
  local_29 = (EqMatcher)value;
  internal::EqMatcher::operator_cast_to_Matcher((Matcher<bool> *)&local_28,&local_29);
  internal::linked_ptr<const_testing::MatcherInterface<bool>_>::operator=
            (&(this->super_MatcherBase<bool>).impl_,&local_28.impl_);
  internal::MatcherBase<bool>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }